

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_undo.cpp
# Opt level: O3

void do_multiple_register(Am_Object *undo_handler,Am_Object *command_obj,bool copy)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object old_command;
  Am_Value_List command_list;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Value_List local_28;
  
  Am_Value_List::Am_Value_List(&local_28);
  Am_Object::Make_Unique(undo_handler,0xc5);
  pAVar2 = Am_Object::Get(undo_handler,0xc5,0);
  Am_Value_List::operator=(&local_28,pAVar2);
  if (copy) {
    Am_Object::Am_Object(&local_30,command_obj);
    copy_command_tree(&local_40);
    Am_Object::operator=(command_obj,&local_40);
    Am_Object::~Am_Object(&local_40);
    Am_Object::~Am_Object(&local_30);
  }
  bVar1 = Am_Value_List::Empty(&local_28);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(command_obj);
    Am_Value_List::Add(&local_28,pAVar3,Am_HEAD,true);
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_28);
    Am_Object::Set(undo_handler,0xc5,pAVar3,0);
  }
  else {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(command_obj);
    Am_Value_List::Add(&local_28,pAVar3,Am_HEAD,false);
    Am_Object::Note_Changed(undo_handler,0xc5);
  }
  local_40.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(undo_handler,0x17a,0);
  Am_Object::operator=(&local_40,pAVar2);
  bVar1 = Am_Object::Valid(&local_40);
  if (bVar1) {
    Am_Object::Am_Object(&local_38,&local_40);
    destroy_command_tree(&local_38);
    Am_Object::~Am_Object(&local_38);
  }
  Am_Object::Set(undo_handler,0x17a,0,0);
  Am_Object::~Am_Object(&local_40);
  Am_Value_List::~Am_Value_List(&local_28);
  return;
}

Assistant:

void
do_multiple_register(Am_Object undo_handler, Am_Object command_obj, bool copy)
{
  Am_Value_List command_list;
  undo_handler.Make_Unique(Am_COMMAND);
  command_list = undo_handler.Get(Am_COMMAND);
  if (copy)
    command_obj = copy_command_tree(command_obj);
  if (command_list.Empty()) {
    command_list.Add(command_obj, Am_HEAD);
    undo_handler.Set(Am_COMMAND, command_list);
  } else {
    // false so don't copy the wrapper object
    command_list.Add(command_obj, Am_HEAD, false);
    undo_handler.Note_Changed(Am_COMMAND);
  }

  // if a pending old_command for Redo, then remove it
  Am_Object old_command;
  old_command = undo_handler.Get(Am_LAST_UNDONE_COMMAND);
  if (old_command.Valid())
    destroy_command_tree(old_command);
  undo_handler.Set(Am_LAST_UNDONE_COMMAND, 0);
}